

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_deleglise_rivat_parallel1.cpp
# Opt level: O0

int256_t * primesum::pi_deleglise_rivat_parallel1(int128_t x,int threads)

{
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  int256_t *piVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> *__a;
  int256_t *this_00;
  long in_RDX;
  long extraout_RDX;
  char *extraout_RDX_00;
  int256_t *extraout_RDX_01;
  int256_t *in_RSI;
  int256_t *in_RDI;
  double dVar3;
  int256_t phi;
  int256_t s2;
  int256_t s1;
  int256_t p2;
  int64_t c;
  int64_t z;
  int64_t y;
  string limit;
  double alpha;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  primesum_error *in_stack_fffffffffffffcf0;
  int256_t *in_stack_fffffffffffffcf8;
  int256_t *in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd08;
  int iVar4;
  undefined1 *alpha_00;
  undefined1 *c_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  undefined8 in_stack_fffffffffffffd38;
  int256_t *this_01;
  long lVar5;
  int256_t *piVar6;
  undefined8 in_stack_fffffffffffffd78;
  int64_t in_stack_fffffffffffffdb8;
  int64_t in_stack_fffffffffffffdc0;
  int64_t in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdd0 [16];
  allocator<char> local_159;
  double in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb4;
  int64_t in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffec0 [16];
  string local_130 [28];
  int in_stack_fffffffffffffeec;
  int64_t in_stack_fffffffffffffef0;
  int64_t in_stack_fffffffffffffef8;
  undefined1 in_stack_ffffffffffffff00 [16];
  string local_68 [48];
  double local_38;
  int256_t *local_28;
  long local_20;
  
  if (-in_RDX < (long)(ulong)((int256_t *)0x1 < in_RSI)) {
    x_03._8_8_ = in_stack_fffffffffffffd78;
    x_03._0_8_ = in_RDI;
    piVar6 = in_RDI;
    local_28 = in_RSI;
    local_20 = in_RDX;
    local_38 = get_alpha_deleglise_rivat((int128_t)x_03);
    get_max_x_abi_cxx11_(in_stack_fffffffffffffea8);
    this_01 = local_28;
    lVar5 = local_20;
    piVar1 = (int256_t *)to_int128(in_stack_fffffffffffffd08);
    if ((SBORROW8(extraout_RDX,lVar5) != SBORROW8(extraout_RDX - lVar5,(ulong)(piVar1 < this_01)))
        != (long)((extraout_RDX - lVar5) - (ulong)(piVar1 < this_01)) < 0) {
      pcVar2 = (char *)__cxa_allocate_exception(0x10,this_01,(long)piVar1 - (long)this_01);
      std::operator+(pcVar2,in_stack_fffffffffffffd30);
      primesum_error::primesum_error
                (in_stack_fffffffffffffcf0,
                 (string *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      __cxa_throw(pcVar2,&primesum_error::typeinfo,primesum_error::~primesum_error);
    }
    x_02._8_8_ = extraout_RDX;
    x_02._0_8_ = lVar5;
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           iroot<3,__int128>((__int128)x_02);
    pcVar2 = extraout_RDX_00;
    dVar3 = (double)__floattidf(this,extraout_RDX_00);
    __divti3(local_28,local_20,(long)(dVar3 * local_38),(long)(dVar3 * local_38) >> 0x3f);
    __a = (allocator<char> *)
          PhiTiny::get_c(CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    c_00 = &stack0xfffffffffffffef7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,pcVar2,__a);
    print((string *)0x141718);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
    alpha_00 = &stack0xfffffffffffffecf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,pcVar2,__a);
    print((string *)0x14176e);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffecf);
    iVar4 = (int)((ulong)&local_159 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,pcVar2,__a);
    print((string *)0x1417c4);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
    std::allocator<char>::~allocator(&local_159);
    x_00._8_8_ = in_stack_fffffffffffffd38;
    x_00._0_8_ = this;
    print((int128_t)x_00,(int64_t)pcVar2,(int64_t)__a,(int64_t)c_00,(double)alpha_00,iVar4);
    iVar4 = (int)((ulong)pcVar2 >> 0x20);
    P2((int128_t)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
    S1((int128_t)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
       in_stack_fffffffffffffeec);
    anon_unknown.dwarf_9ad15::S2
              ((int128_t)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
               in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(int)local_20);
    int256_t::operator+(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    this_00 = (int256_t *)prime_sum_tiny((int64_t)in_RDI);
    x_01._8_8_ = in_stack_fffffffffffffd38;
    x_01._0_8_ = this;
    piVar1 = extraout_RDX_01;
    int256_t::operator+(this_01,(__int128)x_01);
    int256_t::operator-((int256_t *)this,iVar4);
    int256_t::operator-(this_00,piVar1);
    std::__cxx11::string::~string(local_68);
  }
  else {
    int256_t::int256_t<int,void>(in_RDI,0);
    piVar6 = in_RDI;
  }
  return piVar6;
}

Assistant:

int256_t pi_deleglise_rivat_parallel1(int128_t x, int threads)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_deleglise_rivat(x);
  string limit = get_max_x(alpha);

  if (x > to_int128(limit))
    throw primesum_error("pi(x): x must be <= " + limit);

  int64_t y = (int64_t) (iroot<3>(x) * alpha);
  int64_t z = (int64_t) (x / y);
  int64_t c = PhiTiny::get_c(y);

  print("");
  print("=== pi_deleglise_rivat_parallel1(x) ===");
  print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
  print(x, y, z, c, alpha, threads);

  int256_t p2 = P2(x, y, threads);
  int256_t s1 = S1(x, y, c, threads);
  int256_t s2 = S2(x, y, z, c, threads);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return sum;
}